

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::stackUnder_sys(QWidgetPrivate *this,QWidget *param_1)

{
  long lVar1;
  long lVar2;
  QWidgetPrivate *this_00;
  bool bVar3;
  long in_FS_OFFSET;
  QRect local_40 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(*(long *)(lVar1 + 8) + 0x10);
  if (lVar2 == 0) goto LAB_0030fb85;
  setDirtyOpaqueRegion(this);
  this_00 = *(QWidgetPrivate **)(lVar2 + 8);
  lVar1 = *(long *)(lVar1 + 0x20);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
LAB_0030fb69:
    local_40[0] = *(QRect *)(lVar1 + 0x14);
  }
  else {
    bVar3 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if (!bVar3) goto LAB_0030fb69;
    (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_40);
    local_40[0] = (QRect)QRectF::toAlignedRect();
  }
  invalidateBackingStore<QRect>(this_00,local_40);
LAB_0030fb85:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::stackUnder_sys(QWidget*)
{
    Q_Q(QWidget);
    if (QWidget *p = q->parentWidget()) {
        setDirtyOpaqueRegion();
        p->d_func()->invalidateBackingStore(effectiveRectFor(q->geometry()));
    }
}